

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O2

cio_error enqueue_job(cio_websocket *websocket,cio_websocket_write_job *job,size_t length)

{
  cio_error err;
  cio_error cVar1;
  
  if ((websocket->ws_private).first_write_job == (cio_websocket_write_job *)0x0) {
    (websocket->ws_private).first_write_job = job;
    (websocket->ws_private).last_write_job = job;
    err = send_frame(websocket,job,length);
    cVar1 = CIO_SUCCESS;
    if (err != CIO_SUCCESS) {
      handle_error(websocket,err,CIO_WEBSOCKET_CLOSE_INTERNAL_ERROR,"Could not send frame");
      cVar1 = err;
    }
  }
  else {
    ((websocket->ws_private).last_write_job)->next = job;
    (websocket->ws_private).last_write_job = job;
    cVar1 = CIO_SUCCESS;
  }
  return cVar1;
}

Assistant:

static enum cio_error enqueue_job(struct cio_websocket *websocket, struct cio_websocket_write_job *job, size_t length)
{
	if (websocket->ws_private.first_write_job == NULL) {
		websocket->ws_private.first_write_job = job;
		websocket->ws_private.last_write_job = job;
		enum cio_error err = send_frame(websocket, job, length);
		if (cio_unlikely(err != CIO_SUCCESS)) {
			handle_error(websocket, err, CIO_WEBSOCKET_CLOSE_INTERNAL_ERROR, "Could not send frame");
			return err;
		}
	} else {
		websocket->ws_private.last_write_job->next = job;
		websocket->ws_private.last_write_job = job;
	}

	return CIO_SUCCESS;
}